

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

void __thiscall position::set_piece(position *this,char *p,Square *s)

{
  pointer pcVar1;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  ulong uVar3;
  Color color;
  Piece piece;
  Color local_20;
  Piece local_1c;
  
  pcVar1 = SanPiece.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (SanPiece.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     SanPiece.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,p);
  uVar3 = (long)_Var2._M_current - (long)pcVar1;
  if (-1 < (long)uVar3) {
    local_20 = (Color)(5 < uVar3);
    local_1c = (Piece)uVar3 - pieces;
    if (5 >= uVar3) {
      local_1c = (Piece)uVar3;
    }
    piece_data::set(&this->pcs,&local_20,&local_1c,s,&this->ifo);
    if (local_1c == king) {
      (this->ifo).ks[local_20] = *s;
    }
  }
  return;
}

Assistant:

void position::set_piece(const char& p, const Square& s) {
	auto idx = std::distance(SanPiece.begin(), std::find(SanPiece.begin(), SanPiece.end(), p));
	if (idx < 0) return; // error

	Color color = (idx < 6 ? white : black);
	Piece piece = Piece(idx < 6 ? idx : idx - 6);
	pcs.set(color, piece, s, ifo);
	if (piece == king) ifo.ks[color] = s;
}